

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRedcostFixing.cpp
# Opt level: O3

void HighsRedcostFixing::propagateRedCost
               (HighsMipSolver *mipsolver,HighsDomain *localdomain,HighsLpRelaxation *lp)

{
  uint uVar1;
  HighsMipSolverData *pHVar2;
  uint *puVar3;
  pointer ppVar4;
  pointer piVar5;
  long lVar6;
  pointer pdVar7;
  pointer pdVar8;
  HighsInt HVar9;
  HighsBoundType HVar10;
  pointer pHVar11;
  HighsMipSolver *pHVar12;
  bool bVar13;
  byte bVar14;
  HighsDomainChange *pHVar15;
  HighsDomainChange *pHVar16;
  ulong uVar17;
  HighsDomainChange *domchg;
  pointer pHVar18;
  uint *puVar19;
  iterator __end3;
  long lVar20;
  HighsDomainChange *domchg_2;
  double dVar21;
  double dVar22;
  double dVar23;
  HighsInt *pHVar24;
  double dVar25;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  vector<int,_std::allocator<int>_> inds;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> boundChanges;
  vector<double,_std::allocator<double>_> vals;
  double rhs;
  vector<int,_std::allocator<int>_> local_f8;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> local_d8;
  HighsMipSolver *local_b8;
  HighsInt *local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_60;
  pointer local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_88 = lp->objective;
  uStack_80 = 0;
  pHVar2 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_b0 = (HighsInt *)pHVar2->upper_limit;
  local_78 = pHVar2->feastol;
  dStack_70 = pHVar2->epsilon;
  local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
  super__Vector_impl_data._M_start = (HighsDomainChange *)0x0;
  local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
  super__Vector_impl_data._M_finish = (HighsDomainChange *)0x0;
  local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (HighsDomainChange *)0x0;
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::reserve
            (&local_d8,
             (long)*(pointer *)
                    ((long)&(pHVar2->integral_cols).super__Vector_base<int,_std::allocator<int>_> +
                    8) -
             *(long *)&(pHVar2->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl
             >> 2);
  pHVar2 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  puVar19 = *(uint **)&(pHVar2->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl
  ;
  puVar3 = *(uint **)((long)&(pHVar2->integral_cols).super__Vector_base<int,_std::allocator<int>_> +
                     8);
  local_b8 = mipsolver;
  if (puVar19 != puVar3) {
    pHVar24 = (HighsInt *)((double)local_b0 - local_88);
    local_58 = (pointer)((-local_88 - ((double)pHVar24 - (double)local_b0)) +
                         ((double)local_b0 -
                         ((double)pHVar24 - ((double)pHVar24 - (double)local_b0))) + 0.0);
    local_88 = (double)pHVar24 + (double)local_58;
    uStack_80 = 0;
    dVar25 = local_78 * 10.0;
    dStack_70 = dStack_70 * local_88;
    local_78 = dStack_70;
    if (dStack_70 <= dVar25) {
      local_78 = dVar25;
    }
    uStack_50 = 0;
    local_48 = -(double)local_58 - (double)pHVar24;
    uStack_40 = 0x8000000000000000;
    local_b0 = pHVar24;
    do {
      uVar1 = *puVar19;
      lVar20 = (long)(int)uVar1;
      dVar25 = (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start[lVar20];
      dVar21 = (localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start[lVar20];
      if (((dVar25 != dVar21) || (NAN(dVar25) || NAN(dVar21))) &&
         (dVar22 = (lp->lpsolver).solution_.col_dual.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar20], local_78 < ABS(dVar22))) {
        dVar25 = (dVar25 - dVar21) * dVar22;
        if (dVar25 <= local_88) {
          if (dVar25 < local_48) {
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = local_b0;
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58;
            HighsCDouble::operator/=((HighsCDouble *)&local_f8,dVar22);
            dVar25 = (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar20];
            dVar22 = (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + dVar25;
            dVar21 = (dVar25 - (dVar22 - (double)local_f8.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)) +
                     ((double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start -
                     (dVar22 - (dVar22 - (double)local_f8.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start))) +
                     (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
            dVar25 = ((local_b8->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
            local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(dVar22 - dVar25);
            dVar23 = dVar22 - ((double)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start -
                              ((double)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start - dVar22));
            local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((-dVar25 -
                           ((double)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start - dVar22)) + dVar23 +
                          dVar21);
            dVar25 = ceil(dVar21);
            boundchg_00.boundval = (HighsInt *)(dVar25 + dVar23);
            if ((localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar20] < (double)boundchg_00.boundval) {
              pHVar2 = (local_b8->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              if (((*(char *)(*(long *)&(((pHVar2->domain).mipsolver)->model_->integrality_).
                                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                        ._M_impl + lVar20) == '\0') ||
                  (dVar25 = *(double *)
                             (*(long *)&(pHVar2->domain).col_lower_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl
                             + lVar20 * 8), dVar25 != 0.0)) ||
                 ((NAN(dVar25) ||
                  ((dVar25 = *(double *)
                              (*(long *)&(pHVar2->domain).col_upper_.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                              + lVar20 * 8), dVar25 != 1.0 || (NAN(dVar25))))))) {
                boundchg_00.column = uVar1;
                boundchg_00.boundtype = kLower;
                HighsDomain::changeBound(localdomain,boundchg_00,(Reason)0xfffffffe);
                goto LAB_002de4d9;
              }
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = (pointer)(ulong)uVar1;
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = boundchg_00.boundval;
              if (local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_002de4a1;
              std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
              _M_realloc_insert<HighsDomainChange>
                        (&local_d8,
                         (iterator)
                         local_d8.
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(HighsDomainChange *)&local_f8);
            }
          }
        }
        else {
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = local_b0;
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58;
          HighsCDouble::operator/=((HighsCDouble *)&local_f8,dVar22);
          dVar25 = (localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar20];
          dVar22 = (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + dVar25;
          dVar21 = (dVar25 - (dVar22 - (double)local_f8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start)) +
                   ((double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start -
                   (dVar22 - (dVar22 - (double)local_f8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start))) +
                   (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
          dVar25 = ((local_b8->mipdata_)._M_t.
                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(dVar22 + dVar25);
          dVar23 = dVar22 - ((double)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start -
                            ((double)local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start - dVar22));
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((dVar25 - ((double)local_a8.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start - dVar22)) +
                         dVar23 + dVar21);
          dVar25 = floor(dVar21);
          boundchg.boundval = (HighsInt *)(dVar25 + dVar23);
          if ((double)boundchg.boundval <
              (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20]) {
            pHVar2 = (local_b8->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            if ((((*(char *)(*(long *)&(((pHVar2->domain).mipsolver)->model_->integrality_).
                                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                       ._M_impl + lVar20) == '\0') ||
                 (dVar25 = *(double *)
                            (*(long *)&(pHVar2->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar20 * 8), dVar25 != 0.0)) || (NAN(dVar25))) ||
               ((dVar25 = *(double *)
                           (*(long *)&(pHVar2->domain).col_upper_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           lVar20 * 8), dVar25 != 1.0 || (NAN(dVar25))))) {
              boundchg.column = (int)((ulong)uVar1 | 0x100000000);
              boundchg.boundtype = (int)(((ulong)uVar1 | 0x100000000) >> 0x20);
              HighsDomain::changeBound(localdomain,boundchg,(Reason)0xfffffffe);
LAB_002de4d9:
              if (localdomain->infeasible_ != false) goto LAB_002de717;
            }
            else {
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = (pointer)CONCAT44(1,uVar1);
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = boundchg.boundval;
              if (local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                _M_realloc_insert<HighsDomainChange>
                          (&local_d8,
                           (iterator)
                           local_d8.
                           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(HighsDomainChange *)&local_f8
                          );
              }
              else {
LAB_002de4a1:
                (local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->boundval =
                     (double)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                *(pointer *)
                 &(local_d8.
                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl
                   .super__Vector_impl_data._M_finish)->column =
                     local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_d8.
                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
        }
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar3);
  }
  pHVar12 = local_b8;
  if (local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_002de717;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (HighsInt *)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (((ulong)((long)local_d8.
                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)local_d8.
                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                    _M_impl.super__Vector_impl_data._M_start) < 0x650) &&
     (pHVar2 = (local_b8->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
     bVar13 = HighsLpRelaxation::computeDualProof
                        (lp,&pHVar2->domain,pHVar2->upper_limit,&local_f8,&local_a8,&local_60,false)
     , pHVar11 = local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                 _M_impl.super__Vector_impl_data._M_finish, bVar13)) {
    if (local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pHVar2 = (pHVar12->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      ppVar4 = *(pointer *)((long)&(pHVar2->conflictPool).conflictRanges_ + 8);
      piVar5 = *(pointer *)((long)&(pHVar2->conflictPool).deletedConflicts_ + 8);
      lVar20 = *(long *)&(pHVar2->conflictPool).conflictRanges_.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl;
      lVar6 = *(long *)&(pHVar2->conflictPool).deletedConflicts_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl;
      pHVar18 = local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if (pHVar18->boundtype == kLower) {
          if ((localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[pHVar18->column] < pHVar18->boundval)
          goto LAB_002de5fe;
        }
        else if (pHVar18->boundval <
                 (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[pHVar18->column]) {
LAB_002de5fe:
          HighsDomain::conflictAnalyzeReconvergence
                    (localdomain,pHVar18,
                     local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (HighsInt)
                     ((ulong)((long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2),local_60,
                     &((pHVar12->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                      conflictPool);
        }
        pHVar18 = pHVar18 + 1;
      } while (pHVar18 != pHVar11);
      pHVar2 = (pHVar12->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if ((int)((ulong)((long)*(pointer *)((long)&(pHVar2->conflictPool).conflictRanges_ + 8) -
                       *(long *)&(pHVar2->conflictPool).conflictRanges_.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl) >> 3) -
          (int)((ulong)((long)*(pointer *)((long)&(pHVar2->conflictPool).deletedConflicts_ + 8) -
                       *(long *)&(pHVar2->conflictPool).deletedConflicts_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl) >> 2) !=
          (int)((ulong)((long)ppVar4 - lVar20) >> 3) - (int)((ulong)((long)piVar5 - lVar6) >> 2)) {
        HighsDomain::propagate(localdomain);
        if (localdomain->infeasible_ != false) goto LAB_002de6f5;
        uVar17 = (long)local_d8.
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d8.
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        pHVar16 = local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (long)uVar17 >> 6) {
          pHVar15 = (HighsDomainChange *)
                    ((long)&(local_d8.
                             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                             ._M_impl.super__Vector_impl_data._M_start)->boundval +
                    (uVar17 & 0xffffffffffffffc0));
          pdVar7 = (localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar8 = (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar20 = ((long)uVar17 >> 6) + 1;
          pHVar16 = local_d8.
                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                    _M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if (pHVar16[-2].boundtype == kLower) {
              if (pHVar16[-2].boundval <= pdVar7[pHVar16[-2].column]) goto LAB_002de891;
            }
            else if (pdVar8[pHVar16[-2].column] <= pHVar16[-2].boundval) {
LAB_002de891:
              pHVar16 = pHVar16 + -2;
              goto LAB_002de8a4;
            }
            if (pHVar16[-1].boundtype == kLower) {
              if (pHVar16[-1].boundval <= pdVar7[pHVar16[-1].column]) goto LAB_002de897;
            }
            else if (pdVar8[pHVar16[-1].column] <= pHVar16[-1].boundval) {
LAB_002de897:
              pHVar16 = pHVar16 + -1;
              goto LAB_002de8a4;
            }
            if (pHVar16->boundtype == kLower) {
              if (pHVar16->boundval <= pdVar7[pHVar16->column]) goto LAB_002de8a4;
            }
            else if (pdVar8[pHVar16->column] <= pHVar16->boundval) goto LAB_002de8a4;
            if (pHVar16[1].boundtype == kLower) {
              if (pHVar16[1].boundval <= pdVar7[pHVar16[1].column]) goto LAB_002de89d;
            }
            else if (pdVar8[pHVar16[1].column] <= pHVar16[1].boundval) {
LAB_002de89d:
              pHVar16 = pHVar16 + 1;
              goto LAB_002de8a4;
            }
            lVar20 = lVar20 + -1;
            pHVar16 = pHVar16 + 4;
          } while (1 < lVar20);
          uVar17 = (long)local_d8.
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pHVar15;
          pHVar16 = pHVar15;
        }
        lVar20 = (long)uVar17 >> 4;
        if (lVar20 == 1) {
LAB_002de973:
          if (pHVar16->boundtype == kLower) {
            if (pHVar16->boundval <=
                (localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[pHVar16->column]) goto LAB_002de8a4;
          }
          else if ((localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[pHVar16->column] <= pHVar16->boundval)
          goto LAB_002de8a4;
        }
        else {
          if (lVar20 == 2) {
LAB_002de937:
            if (pHVar16->boundtype == kLower) {
              if ((localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[pHVar16->column] < pHVar16->boundval)
              goto LAB_002de96f;
            }
            else if (pHVar16->boundval <
                     (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[pHVar16->column]) {
LAB_002de96f:
              pHVar16 = pHVar16 + 1;
              goto LAB_002de973;
            }
          }
          else {
            if (lVar20 != 3) goto LAB_002de67a;
            if (pHVar16->boundtype == kLower) {
              if ((localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[pHVar16->column] < pHVar16->boundval)
              goto LAB_002de933;
            }
            else if (pHVar16->boundval <
                     (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[pHVar16->column]) {
LAB_002de933:
              pHVar16 = pHVar16 + 1;
              goto LAB_002de937;
            }
          }
LAB_002de8a4:
          pHVar15 = pHVar16;
          if (pHVar16 !=
              local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
joined_r0x002de8b4:
            while (pHVar15 = pHVar15 + 1,
                  pHVar15 !=
                  local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
              if (pHVar15->boundtype == kLower) goto LAB_002de8e9;
              if (pHVar15->boundval <
                  (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[pHVar15->column]) goto LAB_002de8d2;
            }
            if (pHVar16 !=
                local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
              _M_impl.super__Vector_impl_data._M_finish = pHVar16;
            }
          }
        }
      }
    }
LAB_002de67a:
    pHVar11 = local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pHVar18 = local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        HighsDomain::changeBound(localdomain,*pHVar18,(Reason)0xfffffffe);
        if (localdomain->infeasible_ != false) goto LAB_002de6f5;
        pHVar18 = pHVar18 + 1;
      } while (pHVar18 != pHVar11);
      HighsDomain::propagate(localdomain);
    }
  }
  else {
    pHVar11 = local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pHVar18 = local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar14 = localdomain->infeasible_;
    }
    else {
      do {
        HighsDomain::changeBound(localdomain,*pHVar18,(Reason)0xfffffffe);
        bVar14 = localdomain->infeasible_;
        if ((bool)bVar14 != false) break;
        pHVar18 = pHVar18 + 1;
      } while (pHVar18 != pHVar11);
    }
    if ((bVar14 & 1) == 0) {
      HighsDomain::propagate(localdomain);
    }
  }
LAB_002de6f5:
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (HighsInt *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_002de717:
  if (local_d8.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
      super__Vector_impl_data._M_start != (HighsDomainChange *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_002de8e9:
  if ((localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[pHVar15->column] < pHVar15->boundval) {
LAB_002de8d2:
    HVar9 = pHVar15->column;
    HVar10 = pHVar15->boundtype;
    pHVar16->boundval = pHVar15->boundval;
    pHVar16->column = HVar9;
    pHVar16->boundtype = HVar10;
    pHVar16 = pHVar16 + 1;
  }
  goto joined_r0x002de8b4;
}

Assistant:

void HighsRedcostFixing::propagateRedCost(const HighsMipSolver& mipsolver,
                                          HighsDomain& localdomain,
                                          const HighsLpRelaxation& lp) {
  const std::vector<double>& lpredcost = lp.getSolution().col_dual;
  double lpobjective = lp.getObjective();
  HighsCDouble gap =
      HighsCDouble(mipsolver.mipdata_->upper_limit) - lpobjective;

  double tolerance = std::max(10 * mipsolver.mipdata_->feastol,
                              mipsolver.mipdata_->epsilon * double(gap));

  assert(!localdomain.infeasible());
  std::vector<HighsDomainChange> boundChanges;
  boundChanges.reserve(mipsolver.mipdata_->integral_cols.size());
  for (HighsInt col : mipsolver.mipdata_->integral_cols) {
    // lpobj + (col - bnd) * redcost <= cutoffbound
    // (col - bnd) * redcost <= gap
    // redcost * col <= gap + redcost * bnd
    //   case bnd is upper bound  => redcost < 0 :
    //      col >= gap/redcost + ub
    //      <=> redcost < gap / (lb - ub)
    //   case bnd is lower bound  => redcost > 0 :
    //      col <= gap/redcost + lb
    //      <=> redcost > gap / (ub - lb)
    if (localdomain.col_upper_[col] == localdomain.col_lower_[col]) continue;
    if (std::fabs(lpredcost[col]) <= tolerance) continue;

    double maxIncrease = lpredcost[col] * (localdomain.col_upper_[col] -
                                           localdomain.col_lower_[col]);
    if (maxIncrease > gap) {
      assert(localdomain.col_lower_[col] != -kHighsInf);
      assert(lpredcost[col] > tolerance);
      double newub =
          double(floor(gap / lpredcost[col] + localdomain.col_lower_[col] +
                       mipsolver.mipdata_->feastol));
      if (newub >= localdomain.col_upper_[col]) continue;
      assert(newub < localdomain.col_upper_[col]);

      if (mipsolver.mipdata_->domain.isBinary(col)) {
        boundChanges.emplace_back(
            HighsDomainChange{newub, col, HighsBoundType::kUpper});
      } else {
        localdomain.changeBound(HighsBoundType::kUpper, col, newub,
                                HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) return;
      }
    } else if (maxIncrease < -gap) {
      assert(localdomain.col_upper_[col] != kHighsInf);
      assert(lpredcost[col] < -tolerance);
      double newlb =
          double(ceil(gap / lpredcost[col] + localdomain.col_upper_[col] -
                      mipsolver.mipdata_->feastol));

      if (newlb <= localdomain.col_lower_[col]) continue;
      assert(newlb > localdomain.col_lower_[col]);

      if (mipsolver.mipdata_->domain.isBinary(col)) {
        boundChanges.emplace_back(
            HighsDomainChange{newlb, col, HighsBoundType::kLower});
      } else {
        localdomain.changeBound(HighsBoundType::kLower, col, newlb,
                                HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) return;
      }
    }
  }

  if (!boundChanges.empty()) {
    std::vector<HighsInt> inds;
    std::vector<double> vals;
    double rhs;

    if (boundChanges.size() <= 100 &&
        lp.computeDualProof(mipsolver.mipdata_->domain,
                            mipsolver.mipdata_->upper_limit, inds, vals, rhs,
                            false)) {
      bool addedConstraints = false;

      HighsInt oldNumConflicts =
          mipsolver.mipdata_->conflictPool.getNumConflicts();
      for (const HighsDomainChange& domchg : boundChanges) {
        if (localdomain.isActive(domchg)) continue;
        localdomain.conflictAnalyzeReconvergence(
            domchg, inds.data(), vals.data(), inds.size(), rhs,
            mipsolver.mipdata_->conflictPool);
      }
      addedConstraints =
          mipsolver.mipdata_->conflictPool.getNumConflicts() != oldNumConflicts;

      if (addedConstraints) {
        localdomain.propagate();
        if (localdomain.infeasible()) return;

        boundChanges.erase(
            std::remove_if(boundChanges.begin(), boundChanges.end(),
                           [&](const HighsDomainChange& domchg) {
                             return localdomain.isActive(domchg);
                           }),
            boundChanges.end());
      }

      if (!boundChanges.empty()) {
        for (const HighsDomainChange& domchg : boundChanges) {
          localdomain.changeBound(domchg, HighsDomain::Reason::unspecified());
          if (localdomain.infeasible()) break;
        }

        if (!localdomain.infeasible()) localdomain.propagate();
      }
      // /printf("numConflicts: %d\n", numConflicts);
    } else {
      for (const HighsDomainChange& domchg : boundChanges) {
        localdomain.changeBound(domchg, HighsDomain::Reason::unspecified());
        if (localdomain.infeasible()) break;
      }

      if (!localdomain.infeasible()) localdomain.propagate();
    }
  }
}